

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cctest.h
# Opt level: O2

void CheckEqualsHelper(char *file,int line,char *expected_source,int expected,char *value_source,
                      int value)

{
  undefined8 in_RAX;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  
  if ((int)expected_source == (int)value_source) {
    return;
  }
  printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %d\n#  Found:    %d\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-ieee.cc"
         ,(ulong)file & 0xffffffff,CONCAT44(in_register_00000034,line),
         CONCAT44(in_register_0000000c,expected),(ulong)expected_source & 0xffffffff,
         CONCAT44((int)((ulong)in_RAX >> 0x20),(int)value_source));
  abort();
}

Assistant:

static inline void CheckEqualsHelper(const char* file, int line,
                                     const char* expected_source,
                                     int expected,
                                     const char* value_source,
                                     int value) {
  if (expected != value) {
    printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n"
           "#  Expected: %d\n"
           "#  Found:    %d\n",
           file, line, expected_source, value_source, expected, value);
    abort();
  }
}